

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall TPZManVector<float,_10>::Expand(TPZManVector<float,_10> *this,int64_t newsize)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  
  if ((10 < newsize) && ((this->super_TPZVec<float>).fNAlloc < newsize)) {
    pfVar3 = (float *)operator_new__(-(ulong)((ulong)newsize >> 0x3e != 0) | newsize * 4);
    lVar1 = (this->super_TPZVec<float>).fNElements;
    if (0 < lVar1) {
      pfVar2 = (this->super_TPZVec<float>).fStore;
      lVar4 = 0;
      do {
        pfVar3[lVar4] = pfVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
    pfVar2 = (this->super_TPZVec<float>).fStore;
    if (pfVar2 != (float *)0x0 && pfVar2 != this->fExtAlloc) {
      operator_delete__(pfVar2);
    }
    (this->super_TPZVec<float>).fStore = pfVar3;
    (this->super_TPZVec<float>).fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Expand(const int64_t newsize) {
    // If newsize is negative then return.
    if (newsize <= this->fNAlloc || newsize <= NumExtAlloc) {
        return;
    } else {// the size is larger than the allocated memory
        T* newstore = new T[ newsize ];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc) {
            delete [] this->fStore;
        }

        this->fStore = newstore;
        this->fNAlloc = newsize;
    }
}